

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O0

RC __thiscall
RM_FileScan::OpenScan
          (RM_FileScan *this,RM_FileHandle *fileHandle,AttrType attrType,int attrLength,
          int attrOffset,CompOp compOp,void *value,ClientHint pinHint)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  int recSize;
  CompOp compOp_local;
  int attrOffset_local;
  int attrLength_local;
  AttrType attrType_local;
  RM_FileHandle *fileHandle_local;
  RM_FileScan *this_local;
  
  if ((this->openScan & 1U) == 1) {
    this_local._4_4_ = 0x6c;
  }
  else {
    bVar1 = RM_FileHandle::isValidFileHeader(fileHandle);
    if (bVar1) {
      this->fileHandle = fileHandle;
      this->value = (void *)0x0;
      this->compOp = compOp;
      switch(compOp) {
      case NO_OP:
        this->comparator = (_func_bool_void_ptr_void_ptr_AttrType_int *)0x0;
        break;
      case EQ_OP:
        this->comparator = equal;
        break;
      case NE_OP:
        this->comparator = not_equal;
        break;
      case LT_OP:
        this->comparator = less_than;
        break;
      case GT_OP:
        this->comparator = greater_than;
        break;
      case LE_OP:
        this->comparator = less_than_or_eq_to;
        break;
      case GE_OP:
        this->comparator = greater_than_or_eq_to;
        break;
      default:
        return 0x6c;
      }
      iVar2 = RM_FileHandle::getRecordSize(this->fileHandle);
      if (this->compOp != NO_OP) {
        if (((iVar2 < attrOffset + attrLength) || (attrOffset < 0)) || (0xff < attrOffset)) {
          return 0x6c;
        }
        this->attrOffset = attrOffset;
        this->attrLength = attrLength;
        if ((attrType == FLOAT) || (attrType == INT)) {
          if (attrLength != 4) {
            return 0x6c;
          }
          pvVar3 = malloc(4);
          this->value = pvVar3;
          *(undefined4 *)this->value = *value;
          this->initializedValue = true;
        }
        else {
          if (attrType != STRING) {
            return 0x6c;
          }
          pvVar3 = malloc((long)attrLength);
          this->value = pvVar3;
          memcpy(this->value,value,(long)attrLength);
          this->initializedValue = true;
        }
        this->attrType = attrType;
      }
      this->openScan = true;
      this->scanEnded = false;
      this->numRecOnPage = 0;
      this->numSeenOnPage = 0;
      this->useNextPage = true;
      this->scanPage = 0;
      this->scanSlot = -1;
      this->numSeenOnPage = 0;
      this->hasPagePinned = false;
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 0x6a;
    }
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileScan::OpenScan (const RM_FileHandle &fileHandle,
                  AttrType   attrType,
                  int        attrLength,
                  int        attrOffset,
                  CompOp     compOp,
                  void       *value,
                  ClientHint pinHint) {
  // If this is already associated with a scan, return immediately as an error
  if (openScan == true)
    return (RM_INVALIDSCAN);

  // Check that the fileHandle is valid
  if(fileHandle.isValidFileHeader())
    this->fileHandle = const_cast<RM_FileHandle*>(&fileHandle);
  else
    return (RM_INVALIDFILE);

  this->value = NULL;
  // Set the comparator to the appropriate function
  this->compOp = compOp;
  switch(compOp){
    case EQ_OP : comparator = &equal; break;
    case LT_OP : comparator = &less_than; break;
    case GT_OP : comparator = &greater_than; break;
    case LE_OP : comparator = &less_than_or_eq_to; break;
    case GE_OP : comparator = &greater_than_or_eq_to; break;
    case NE_OP : comparator = &not_equal; break;
    case NO_OP : comparator = NULL; break;
    default: return (RM_INVALIDSCAN);
  }

  int recSize = (this->fileHandle)->getRecordSize();
  // If there is a comparison, update the comparison parameters.
  if(this->compOp != NO_OP){
    // Check that the attribute offset and sizes are compatible with given
    // FileHandle
    if((attrOffset + attrLength) > recSize || attrOffset < 0 || attrOffset > MAXSTRINGLEN)
      return (RM_INVALIDSCAN);
    this->attrOffset = attrOffset;
    this->attrLength = attrLength;

    // Allocate the appropraite memory to store the value being compared
    if(attrType == FLOAT || attrType == INT){
      if(attrLength != 4)
        return (RM_INVALIDSCAN);
      this->value = (void *) malloc(4);
      memcpy(this->value, value, 4);
      initializedValue = true;
    }
    else if(attrType == STRING){
      this->value = (void *) malloc(attrLength);
      memcpy(this->value, value, attrLength);
      initializedValue = true;
    }
    else{
      return (RM_INVALIDSCAN);
    }
    this->attrType = attrType;
  }

  // open the scan
  openScan = true;
  scanEnded = false;

  // set up scan parameters:
  numRecOnPage = 0;
  numSeenOnPage = 0;
  useNextPage = true;
  scanPage = 0;
  scanSlot = BEGIN_SCAN;
  numSeenOnPage = 0;
  hasPagePinned = false;
  return (0);
}